

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O0

string * tinyusdz::unwrap(string *__return_storage_ptr__,string *str,string *l,string *r)

{
  string local_48;
  string *local_28;
  string *r_local;
  string *l_local;
  string *str_local;
  
  local_28 = r;
  r_local = l;
  l_local = str;
  str_local = __return_storage_ptr__;
  removeSuffix(&local_48,str,r);
  removePrefix((tinyusdz *)__return_storage_ptr__,(string *)&local_48,(string *)r_local);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string unwrap(const std::string &str, const std::string &l,
                          const std::string &r) {
  return removePrefix(removeSuffix(str, r), l);
}